

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::OnElse(TypeChecker *this)

{
  LabelType LVar1;
  Result RVar2;
  Result RVar3;
  Label *in_RAX;
  Enum EVar4;
  Label *local_38;
  Label *label;
  
  local_38 = in_RAX;
  RVar2 = TopLabel(this,&local_38);
  if (RVar2.enum_ == Error) {
    EVar4 = Error;
  }
  else {
    LVar1 = local_38->label_type;
    RVar2 = PopAndCheckSignature(this,&local_38->result_types,"if true branch");
    RVar3 = CheckTypeStackEnd(this,"if true branch");
    EVar4 = (Enum)((RVar3.enum_ == Error || RVar2.enum_ == Error) || LVar1 != If);
    ResetTypeStackToLabel(this,local_38);
    PushTypes(this,&local_38->param_types);
    local_38->label_type = Else;
    local_38->unreachable = false;
  }
  return (Result)EVar4;
}

Assistant:

Result TypeChecker::OnElse() {
  Result result = Result::Ok;
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  result |= CheckLabelType(label, LabelType::If);
  result |= PopAndCheckSignature(label->result_types, "if true branch");
  result |= CheckTypeStackEnd("if true branch");
  ResetTypeStackToLabel(label);
  PushTypes(label->param_types);
  label->label_type = LabelType::Else;
  label->unreachable = false;
  return result;
}